

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeAdvancedBlendEquationTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::attachment_advanced_equation
               (NegativeTestContext *ctx)

{
  BlendEquation equation;
  RenderContext *renderCtx;
  bool bVar1;
  ContextType ctxType;
  GLenum GVar2;
  TestError *this;
  NotSupportedError *this_00;
  long lVar3;
  GLuint texture;
  GLuint fbo;
  GLenum attachments [2];
  string local_1f0;
  ShaderProgram program;
  ProgramSources local_100;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"GL_KHR_blend_equation_advanced",(allocator<char> *)&program);
  bVar1 = NegativeTestContext::isExtensionSupported(ctx,&local_1f0);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  else {
    ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
    bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
    std::__cxx11::string::~string((string *)&local_1f0);
    if (!bVar1) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,
                 "This test requires support for the extension GL_KHR_blend_equation_advanced or context version 3.2 or higher."
                 ,
                 "ctx.isExtensionSupported(\"GL_KHR_blend_equation_advanced\") || contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2))"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeAdvancedBlendEquationTests.cpp"
                 ,0xd4);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  fbo = 0x1234;
  texture = 0x1234;
  attachments[0] = 0x8ce0;
  attachments[1] = 0x8ce1;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,1,&texture);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0xde1,texture);
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0x8058,0x20,0x20,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glGenFramebuffers(&ctx->super_CallLogWrapper,1,&fbo);
  glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,fbo);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&ctx->super_CallLogWrapper,0x8d40,0x8ce0,0xde1,texture,0);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glCheckFramebufferStatus(&ctx->super_CallLogWrapper,0x8d40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program,
             "GL_INVALID_OPERATION is generated if blending is enabled, advanced equations are used, and the draw buffer for other color outputs is not NONE."
             ,(allocator<char> *)&local_100);
  NegativeTestContext::beginSection(ctx,(string *)&program);
  std::__cxx11::string::~string((string *)&program);
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 0x3c) {
      NegativeTestContext::endSection(ctx);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&program,
                 "GL_NO_ERROR is generated if no advanced blend equations are used.",
                 (allocator<char> *)&local_100);
      NegativeTestContext::beginSection(ctx,(string *)&program);
      std::__cxx11::string::~string((string *)&program);
      glu::CallLogWrapper::glBlendEquation(&ctx->super_CallLogWrapper,0x8006);
      glu::CallLogWrapper::glDrawElements(&ctx->super_CallLogWrapper,4,0,0x1405,(void *)0x0);
      NegativeTestContext::expectError(ctx,0);
      NegativeTestContext::endSection(ctx);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&program,"GL_NO_ERROR is generated if blending is disabled.",
                 (allocator<char> *)&local_100);
      NegativeTestContext::beginSection(ctx,(string *)&program);
      std::__cxx11::string::~string((string *)&program);
      glu::CallLogWrapper::glDisable(&ctx->super_CallLogWrapper,0xbe2);
      for (lVar3 = 0; lVar3 != 0x3c; lVar3 = lVar3 + 4) {
        GVar2 = getEquation(*(BlendEquation *)
                             ((long)&NegativeTestShared::(anonymous_namespace)::s_equations + lVar3)
                           );
        glu::CallLogWrapper::glBlendEquation(&ctx->super_CallLogWrapper,GVar2);
        glu::CallLogWrapper::glDrawElements(&ctx->super_CallLogWrapper,4,0,0x1405,(void *)0x0);
        NegativeTestContext::expectError(ctx,0);
      }
      NegativeTestContext::endSection(ctx);
      glu::CallLogWrapper::glDeleteFramebuffers(&ctx->super_CallLogWrapper,1,&fbo);
      glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,1,&texture);
      return;
    }
    renderCtx = ctx->m_renderCtx;
    equation = *(BlendEquation *)
                ((long)&NegativeTestShared::(anonymous_namespace)::s_equations + lVar3);
    generateProgramSources(&local_100,ctx,equation);
    glu::ShaderProgram::ShaderProgram(&program,renderCtx,&local_100);
    glu::ProgramSources::~ProgramSources(&local_100);
    glu::operator<<((ctx->super_CallLogWrapper).m_log,&program);
    if (program.m_program.m_info.linkOk == false) break;
    glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,program.m_program.m_program);
    glu::CallLogWrapper::glEnable(&ctx->super_CallLogWrapper,0xbe2);
    glu::CallLogWrapper::glDrawBuffers(&ctx->super_CallLogWrapper,2,attachments);
    NegativeTestContext::expectError(ctx,0);
    GVar2 = getEquation(equation);
    glu::CallLogWrapper::glBlendEquation(&ctx->super_CallLogWrapper,GVar2);
    glu::CallLogWrapper::glDrawElements(&ctx->super_CallLogWrapper,4,0,0x1405,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x502);
    glu::ShaderProgram::~ShaderProgram(&program);
    lVar3 = lVar3 + 4;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,"program.isOk()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeAdvancedBlendEquationTests.cpp"
             ,0xe8);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void attachment_advanced_equation (NegativeTestContext& ctx)
{
	TCU_CHECK_AND_THROW(NotSupportedError,
		ctx.isExtensionSupported("GL_KHR_blend_equation_advanced") || contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)),
		"This test requires support for the extension GL_KHR_blend_equation_advanced or context version 3.2 or higher.");

	glw::GLuint			fbo				= 0x1234;
	glw::GLuint			texture			= 0x1234;
	const glw::GLenum	attachments[]	= { GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1 };

	ctx.glGenTextures(1, &texture);
	ctx.glBindTexture(GL_TEXTURE_2D, texture);
	ctx.glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, NULL);
	ctx.glGenFramebuffers(1, &fbo);
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, fbo);
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, texture, 0);
	ctx.expectError(GL_NO_ERROR);
	ctx.glCheckFramebufferStatus(GL_FRAMEBUFFER);

	ctx.beginSection("GL_INVALID_OPERATION is generated if blending is enabled, advanced equations are used, and the draw buffer for other color outputs is not NONE.");
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_equations); ++ndx)
	{
		glu::ShaderProgram	program(ctx.getRenderContext(), generateProgramSources(ctx, s_equations[ndx]));
		ctx.getLog() << program;
		TCU_CHECK(program.isOk());

		ctx.glUseProgram(program.getProgram());
		ctx.glEnable(GL_BLEND);
		ctx.glDrawBuffers(2, attachments);
		ctx.expectError(GL_NO_ERROR);
		ctx.glBlendEquation(getEquation(s_equations[ndx]));
		ctx.glDrawElements(GL_TRIANGLES, 0, GL_UNSIGNED_INT, 0);
		ctx.expectError(GL_INVALID_OPERATION);
	}
	ctx.endSection();

	ctx.beginSection("GL_NO_ERROR is generated if no advanced blend equations are used.");
	ctx.glBlendEquation(GL_FUNC_ADD);
	ctx.glDrawElements(GL_TRIANGLES, 0, GL_UNSIGNED_INT, 0);
	ctx.expectError(GL_NO_ERROR);
	ctx.endSection();

	ctx.beginSection("GL_NO_ERROR is generated if blending is disabled.");
	ctx.glDisable(GL_BLEND);
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_equations); ++ndx)
	{
		ctx.glBlendEquation(getEquation(s_equations[ndx]));
		ctx.glDrawElements(GL_TRIANGLES, 0, GL_UNSIGNED_INT, 0);
		ctx.expectError(GL_NO_ERROR);
	}
	ctx.endSection();

	ctx.glDeleteFramebuffers(1, &fbo);
	ctx.glDeleteTextures(1, &texture);
}